

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O2

DdHalfWord ** getMatrix(int rows,int cols)

{
  DdHalfWord **__ptr;
  DdHalfWord *pDVar1;
  long lVar2;
  
  if (cols * rows != 0) {
    __ptr = (DdHalfWord **)malloc((long)rows * 8);
    if (__ptr != (DdHalfWord **)0x0) {
      pDVar1 = (DdHalfWord *)malloc((long)(cols * rows) << 2);
      *__ptr = pDVar1;
      if (pDVar1 != (DdHalfWord *)0x0) {
        for (lVar2 = 1; lVar2 < rows; lVar2 = lVar2 + 1) {
          __ptr[lVar2] = __ptr[lVar2 + -1] + cols;
        }
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (DdHalfWord **)0x0;
}

Assistant:

static DdHalfWord **
getMatrix(
  int  rows /* number of rows */,
  int  cols /* number of columns */)
{
    DdHalfWord **matrix;
    int i;

    if (cols*rows == 0) return(NULL);
    matrix = ABC_ALLOC(DdHalfWord *, rows);
    if (matrix == NULL) return(NULL);
    matrix[0] = ABC_ALLOC(DdHalfWord, cols*rows);
    if (matrix[0] == NULL) {
        ABC_FREE(matrix);
        return(NULL);
    }
    for (i = 1; i < rows; i++) {
        matrix[i] = matrix[i-1] + cols;
    }
    return(matrix);

}